

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int get_crl_sk(X509_STORE_CTX *ctx,X509_CRL **pcrl,X509 **pissuer,int *pscore,
              stack_st_X509_CRL *crls)

{
  X509 *a;
  DIST_POINT_NAME *pDVar1;
  X509_CRL **ppXVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  X509_CRL *crl;
  X509_NAME *pXVar6;
  X509_NAME *pXVar7;
  X509 *issuer;
  size_t sVar8;
  long *plVar9;
  OPENSSL_STACK *sk;
  DIST_POINT_NAME *pDVar10;
  int *piVar11;
  size_t sVar12;
  GENERAL_NAME *a_00;
  GENERAL_NAME *b;
  ASN1_TIME *from;
  ASN1_TIME *to;
  size_t sVar13;
  ulong i;
  uint uVar14;
  DIST_POINT_NAME *pDVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  int sec;
  int day;
  X509_CRL *local_98;
  X509 *local_88;
  X509 *local_80;
  int local_58;
  int local_54;
  DIST_POINT_NAME *local_50;
  X509_CRL **local_48;
  X509 **local_40;
  uint *local_38;
  
  uVar14 = *pscore;
  a = (X509 *)ctx->current_cert;
  local_48 = pcrl;
  local_40 = pissuer;
  local_38 = (uint *)pscore;
  sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)crls);
  if (sVar5 == 0) {
    local_98 = (X509_CRL *)0x0;
    local_88 = (X509 *)0x0;
  }
  else {
    sVar5 = 0;
    local_88 = (X509 *)0x0;
    local_98 = (X509_CRL *)0x0;
    local_80 = (X509 *)0x0;
    do {
      crl = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)crls,sVar5);
      if ((crl->idp_flags & 0x62) == 0) {
        pXVar6 = X509_get_issuer_name(a);
        pXVar7 = X509_CRL_get_issuer(crl);
        iVar4 = X509_NAME_cmp(pXVar6,(X509_NAME *)pXVar7);
        if (iVar4 == 0) {
          uVar3 = crl->flags;
          iVar4 = check_crl_time(ctx,crl,0);
          uVar3 = iVar4 * 0x40 + (uint)((uVar3 >> 9 & 1) == 0) * 0x100 + 0x20;
          pXVar7 = X509_CRL_get_issuer(crl);
          iVar4 = ctx->error_depth;
          sVar13 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
          sVar13 = (ulong)(sVar13 - 1 != (long)iVar4) + (long)iVar4;
          issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,sVar13);
          iVar4 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid);
          if (iVar4 == 0) {
            uVar3 = uVar3 | 0x1c;
LAB_004b893c:
            bVar17 = false;
            local_80 = issuer;
          }
          else {
            iVar4 = (int)sVar13 + 1;
            sVar13 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
            bVar17 = true;
            if (iVar4 < (int)sVar13) {
              sVar13 = (size_t)iVar4;
              do {
                issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,sVar13);
                pXVar6 = X509_get_subject_name(issuer);
                iVar4 = X509_NAME_cmp(pXVar6,(X509_NAME *)pXVar7);
                if ((iVar4 == 0) &&
                   (iVar4 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid), iVar4 == 0)) {
                  uVar3 = uVar3 | 0xc;
                  goto LAB_004b893c;
                }
                sVar13 = sVar13 + 1;
                sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
              } while ((long)sVar13 < (long)(int)sVar8);
              bVar17 = true;
            }
          }
          if (bVar17) goto LAB_004b8825;
          uVar16 = crl->idp_flags;
          bVar17 = true;
          if ((uVar16 & 0x10) == 0) {
            if (((a->ex_data).dummy & 0x10) == 0) {
              uVar16 = uVar16 & 8;
            }
            else {
              uVar16 = uVar16 & 4;
            }
            if (uVar16 == 0) {
              sVar13 = OPENSSL_sk_num((OPENSSL_STACK *)a->ex_kusage);
              if (sVar13 != 0) {
                bVar17 = true;
                sVar13 = 0;
                do {
                  plVar9 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)a->ex_kusage,sVar13);
                  bVar18 = false;
                  if ((plVar9[1] == 0) && (plVar9[2] == 0)) {
                    if ((crl->idp == (ISSUING_DIST_POINT *)0x0) ||
                       (pDVar15 = (DIST_POINT_NAME *)*plVar9, pDVar15 == (DIST_POINT_NAME *)0x0)) {
                      bVar18 = true;
                    }
                    else {
                      pDVar1 = crl->idp->distpoint;
                      if (pDVar1 == (DIST_POINT_NAME *)0x0) {
LAB_004b8ac5:
                        bVar18 = true;
                      }
                      else if (pDVar15->type == 1) {
                        pXVar7 = pDVar15->dpname;
                        bVar18 = false;
                        if (pXVar7 != (X509_NAME *)0x0) {
                          pDVar10 = pDVar1;
                          if (pDVar1->type != 1) {
LAB_004b8a58:
                            sk = (OPENSSL_STACK *)(pDVar10->name).fullname;
                            goto LAB_004b8a5c;
                          }
                          if (pDVar1->dpname != (X509_NAME *)0x0) {
                            iVar4 = X509_NAME_cmp((X509_NAME *)pXVar7,(X509_NAME *)pDVar1->dpname);
                            bVar18 = iVar4 == 0;
                          }
                        }
                      }
                      else if (pDVar1->type == 1) {
                        pXVar7 = pDVar1->dpname;
                        pDVar10 = pDVar15;
                        if (pXVar7 != (X509_NAME *)0x0) goto LAB_004b8a58;
                        bVar18 = false;
                      }
                      else {
                        pXVar7 = (X509_NAME *)0x0;
                        sk = (OPENSSL_STACK *)0x0;
LAB_004b8a5c:
                        if (pXVar7 == (X509_NAME *)0x0) {
                          local_50 = pDVar15;
                          sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar15->name).fullname);
                          bVar18 = false;
                          if (sVar8 != 0) {
                            i = 0;
                            pDVar15 = local_50;
                            do {
                              a_00 = (GENERAL_NAME *)
                                     OPENSSL_sk_value((OPENSSL_STACK *)(pDVar15->name).fullname,i);
                              sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar1->name).fullname);
                              if (sVar8 != 0) {
                                sVar8 = 0;
                                do {
                                  b = (GENERAL_NAME *)
                                      OPENSSL_sk_value((OPENSSL_STACK *)(pDVar1->name).fullname,
                                                       sVar8);
                                  iVar4 = GENERAL_NAME_cmp(a_00,b);
                                  if (iVar4 == 0) {
                                    bVar18 = true;
                                    goto LAB_004b8acf;
                                  }
                                  sVar8 = sVar8 + 1;
                                  sVar12 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar1->name).fullname);
                                } while (sVar8 < sVar12);
                              }
                              pDVar15 = local_50;
                              i = i + 1;
                              sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)(local_50->name).fullname);
                            } while (i < sVar8);
                          }
                        }
                        else {
                          sVar8 = OPENSSL_sk_num(sk);
                          bVar18 = false;
                          if (sVar8 != 0) {
                            sVar8 = 0;
                            do {
                              piVar11 = (int *)OPENSSL_sk_value(sk,sVar8);
                              if ((*piVar11 == 4) &&
                                 (iVar4 = X509_NAME_cmp((X509_NAME *)pXVar7,
                                                        *(X509_NAME **)(piVar11 + 2)), iVar4 == 0))
                              goto LAB_004b8ac5;
                              sVar8 = sVar8 + 1;
                              sVar12 = OPENSSL_sk_num(sk);
                            } while (sVar8 < sVar12);
                            bVar18 = false;
                          }
                        }
                      }
                    }
                  }
LAB_004b8acf:
                  if (bVar18) {
                    if (bVar17) goto LAB_004b8bbd;
                    break;
                  }
                  sVar13 = sVar13 + 1;
                  sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)a->ex_kusage);
                  bVar17 = sVar13 < sVar8;
                } while (bVar17);
              }
              if (crl->idp == (ISSUING_DIST_POINT *)0x0) {
LAB_004b8bbd:
                bVar17 = false;
              }
              else {
                bVar17 = crl->idp->distpoint != (DIST_POINT_NAME *)0x0;
              }
            }
          }
          uVar16 = uVar3 | 0x80;
          if (bVar17) {
            uVar16 = uVar3;
          }
        }
        else {
          uVar16 = 0;
        }
      }
      else {
LAB_004b8825:
        uVar16 = 0;
      }
      if (uVar16 != 0 && (int)uVar14 <= (int)uVar16) {
        if ((uVar16 == uVar14) && (local_98 != (X509_CRL *)0x0)) {
          from = X509_CRL_get0_lastUpdate(local_98);
          to = X509_CRL_get0_lastUpdate(crl);
          iVar4 = ASN1_TIME_diff(&local_54,&local_58,from,to);
          if ((iVar4 == 0) || ((local_54 < 1 && (local_58 < 1)))) goto LAB_004b8c4b;
        }
        local_88 = local_80;
        uVar14 = uVar16;
        local_98 = crl;
      }
LAB_004b8c4b:
      sVar5 = sVar5 + 1;
      sVar13 = OPENSSL_sk_num((OPENSSL_STACK *)crls);
    } while (sVar5 < sVar13);
  }
  ppXVar2 = local_48;
  if (local_98 != (X509_CRL *)0x0) {
    if ((X509_CRL *)*local_48 != (X509_CRL *)0x0) {
      X509_CRL_free((X509_CRL *)*local_48);
    }
    *ppXVar2 = local_98;
    *local_40 = (X509 *)local_88;
    *local_38 = uVar14;
    X509_CRL_up_ref(local_98);
  }
  return (int)(0x1bf < (int)uVar14);
}

Assistant:

static int get_crl_sk(X509_STORE_CTX *ctx, X509_CRL **pcrl, X509 **pissuer,
                      int *pscore, STACK_OF(X509_CRL) *crls) {
  int crl_score, best_score = *pscore;
  X509 *x = ctx->current_cert;
  X509_CRL *best_crl = NULL;
  X509 *crl_issuer = NULL, *best_crl_issuer = NULL;

  for (size_t i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    crl_score = get_crl_score(ctx, &crl_issuer, crl, x);
    if (crl_score < best_score || crl_score == 0) {
      continue;
    }
    // If current CRL is equivalent use it if it is newer
    if (crl_score == best_score && best_crl != NULL) {
      int day, sec;
      if (ASN1_TIME_diff(&day, &sec, X509_CRL_get0_lastUpdate(best_crl),
                         X509_CRL_get0_lastUpdate(crl)) == 0) {
        continue;
      }
      // ASN1_TIME_diff never returns inconsistent signs for |day|
      // and |sec|.
      if (day <= 0 && sec <= 0) {
        continue;
      }
    }
    best_crl = crl;
    best_crl_issuer = crl_issuer;
    best_score = crl_score;
  }

  if (best_crl) {
    if (*pcrl) {
      X509_CRL_free(*pcrl);
    }
    *pcrl = best_crl;
    *pissuer = best_crl_issuer;
    *pscore = best_score;
    X509_CRL_up_ref(best_crl);
  }

  if (best_score >= CRL_SCORE_VALID) {
    return 1;
  }

  return 0;
}